

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::lowerExtendSInt64(I64ToI32Lowering *this,Unary *curr)

{
  LocalSet *append;
  LocalSet *any;
  Index IVar1;
  Index index;
  pointer pBVar2;
  pointer pBVar3;
  pointer pBVar4;
  LocalGet *pLVar5;
  Const *right;
  Binary *value;
  unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *this_00;
  Type local_c8;
  Block *local_c0;
  Block *result;
  LocalSet *local_b0;
  LocalSet *setHigh;
  LocalSet *setLow;
  Expression *lowValue;
  Type local_68;
  undefined1 local_60 [8];
  TempVar lowBits;
  undefined1 local_38 [8];
  TempVar highBits;
  Unary *curr_local;
  I64ToI32Lowering *this_local;
  
  highBits.ty.id = (uintptr_t)curr;
  wasm::Type::Type(&lowBits.ty,i32);
  getTemp((TempVar *)local_38,this,lowBits.ty);
  wasm::Type::Type(&local_68,i32);
  getTemp((TempVar *)local_60,this,local_68);
  fetchOutParam((TempVar *)&lowValue,this,*(Expression **)(highBits.ty.id + 0x18));
  TempVar::~TempVar((TempVar *)&lowValue);
  setLow = *(LocalSet **)(highBits.ty.id + 0x18);
  if (*(int *)(highBits.ty.id + 0x10) == 0x31) {
    pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    setLow = (LocalSet *)Builder::makeUnary(pBVar2,ExtendS8Int32,(Expression *)setLow);
  }
  else if (*(int *)(highBits.ty.id + 0x10) == 0x32) {
    pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    setLow = (LocalSet *)Builder::makeUnary(pBVar2,ExtendS16Int32,(Expression *)setLow);
  }
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_60);
  setHigh = Builder::makeLocalSet(pBVar2,IVar1,(Expression *)setLow);
  this_00 = &this->builder;
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_00);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_38);
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_00);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_00);
  index = TempVar::operator_cast_to_unsigned_int((TempVar *)local_60);
  wasm::Type::Type((Type *)&result,i32);
  pLVar5 = Builder::makeLocalGet(pBVar4,index,(Type)result);
  pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  right = Builder::makeConst<int>(pBVar4,0x1f);
  value = Builder::makeBinary(pBVar3,ShrSInt32,(Expression *)pLVar5,(Expression *)right);
  local_b0 = Builder::makeLocalSet(pBVar2,IVar1,(Expression *)value);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  any = setHigh;
  append = local_b0;
  pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_60);
  wasm::Type::Type(&local_c8,i32);
  pLVar5 = Builder::makeLocalGet(pBVar3,IVar1,local_c8);
  local_c0 = Builder::blockify<wasm::LocalGet*>
                       (pBVar2,(Expression *)any,(Expression *)append,pLVar5);
  setOutParam(this,(Expression *)local_c0,(TempVar *)local_38);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)local_c0);
  TempVar::~TempVar((TempVar *)local_60);
  TempVar::~TempVar((TempVar *)local_38);
  return;
}

Assistant:

void lowerExtendSInt64(Unary* curr) {
    TempVar highBits = getTemp();
    TempVar lowBits = getTemp();

    // free the temp var
    fetchOutParam(curr->value);

    Expression* lowValue = curr->value;
    switch (curr->op) {
      case ExtendS8Int64:
        lowValue = builder->makeUnary(ExtendS8Int32, lowValue);
        break;
      case ExtendS16Int64:
        lowValue = builder->makeUnary(ExtendS16Int32, lowValue);
        break;
      default:
        break;
    }

    LocalSet* setLow = builder->makeLocalSet(lowBits, lowValue);
    LocalSet* setHigh = builder->makeLocalSet(
      highBits,
      builder->makeBinary(ShrSInt32,
                          builder->makeLocalGet(lowBits, Type::i32),
                          builder->makeConst(int32_t(31))));

    Block* result = builder->blockify(
      setLow, setHigh, builder->makeLocalGet(lowBits, Type::i32));

    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }